

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Scene *pSVar17;
  float **ppfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  RTCRayN *pRVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  undefined4 uVar45;
  ulong unaff_R12;
  size_t mask;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  NodeRef *pNVar49;
  NodeRef *pNVar50;
  bool bVar51;
  bool bVar52;
  float fVar53;
  float fVar66;
  float fVar67;
  undefined1 auVar54 [16];
  float fVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar87;
  float fVar88;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar89;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar98;
  float fVar99;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar109;
  float fVar112;
  undefined1 auVar104 [16];
  float fVar115;
  undefined1 auVar105 [16];
  float fVar113;
  float fVar116;
  undefined1 auVar106 [16];
  float fVar110;
  float fVar111;
  float fVar114;
  float fVar117;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar118;
  float fVar122;
  float fVar123;
  undefined1 auVar119 [16];
  float fVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [16];
  float fVar132;
  float fVar136;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 local_b78 [16];
  ulong local_b68;
  NodeRef *local_b60;
  Scene *scene;
  float fStack_b50;
  float fStack_b4c;
  uint *local_b48;
  float fStack_b40;
  float fStack_b3c;
  undefined1 (*local_b38) [16];
  long local_b30;
  RTCFilterFunctionNArguments args;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_ae0;
  float fStack_adc;
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [8];
  float fStack_930;
  float fStack_92c;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined1 local_8a8 [16];
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  uint local_888;
  uint uStack_884;
  uint uStack_880;
  uint uStack_87c;
  uint local_878;
  uint uStack_874;
  uint uStack_870;
  uint uStack_86c;
  uint local_868;
  uint uStack_864;
  uint uStack_860;
  uint uStack_85c;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_808;
  float fStack_800;
  float fStack_7fc;
  undefined8 local_7f8;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  undefined1 auVar133 [16];
  
  stack[0] = root;
  fVar12 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar13 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar151 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar156 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar181 = fVar151 * 0.99999964;
  fVar190 = fVar156 * 0.99999964;
  fVar172 = fVar167 * 0.99999964;
  fVar151 = fVar151 * 1.0000004;
  fVar156 = fVar156 * 1.0000004;
  fVar167 = fVar167 * 1.0000004;
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = uVar46 ^ 0x10;
  iVar43 = (tray->tnear).field_0.i[k];
  auVar104._4_4_ = iVar43;
  auVar104._0_4_ = iVar43;
  auVar104._8_4_ = iVar43;
  auVar104._12_4_ = iVar43;
  iVar43 = (tray->tfar).field_0.i[k];
  auVar119._4_4_ = iVar43;
  auVar119._0_4_ = iVar43;
  auVar119._8_4_ = iVar43;
  auVar119._12_4_ = iVar43;
  local_7e8 = (float)mm_lookupmask_ps._0_8_;
  fStack_7e4 = SUB84(mm_lookupmask_ps._0_8_,4);
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_858 = mm_lookupmask_ps._240_16_;
  local_b38 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar50 = stack + 1;
  local_b68 = uVar46;
LAB_00294b1e:
  pNVar49 = pNVar50;
  if (pNVar49 != stack) {
    pNVar50 = pNVar49 + -1;
    uVar40 = pNVar49[-1].ptr;
    do {
      if ((uVar40 & 8) == 0) {
        pfVar11 = (float *)(uVar40 + 0x20 + uVar46);
        auVar54._0_4_ = (*pfVar11 - fVar12) * fVar181;
        auVar54._4_4_ = (pfVar11[1] - fVar12) * fVar181;
        auVar54._8_4_ = (pfVar11[2] - fVar12) * fVar181;
        auVar54._12_4_ = (pfVar11[3] - fVar12) * fVar181;
        pfVar11 = (float *)(uVar40 + 0x20 + uVar41);
        auVar93._0_4_ = (*pfVar11 - fVar13) * fVar190;
        auVar93._4_4_ = (pfVar11[1] - fVar13) * fVar190;
        auVar93._8_4_ = (pfVar11[2] - fVar13) * fVar190;
        auVar93._12_4_ = (pfVar11[3] - fVar13) * fVar190;
        auVar54 = maxps(auVar54,auVar93);
        pfVar11 = (float *)(uVar40 + 0x20 + uVar42);
        auVar70._0_4_ = (*pfVar11 - fVar14) * fVar172;
        auVar70._4_4_ = (pfVar11[1] - fVar14) * fVar172;
        auVar70._8_4_ = (pfVar11[2] - fVar14) * fVar172;
        auVar70._12_4_ = (pfVar11[3] - fVar14) * fVar172;
        auVar71 = maxps(auVar70,auVar104);
        auVar54 = maxps(auVar54,auVar71);
        pfVar11 = (float *)(uVar40 + 0x20 + uVar44);
        auVar72._0_4_ = (*pfVar11 - fVar12) * fVar151;
        auVar72._4_4_ = (pfVar11[1] - fVar12) * fVar151;
        auVar72._8_4_ = (pfVar11[2] - fVar12) * fVar151;
        auVar72._12_4_ = (pfVar11[3] - fVar12) * fVar151;
        pfVar11 = (float *)(uVar40 + 0x20 + (uVar41 ^ 0x10));
        auVar91._0_4_ = (*pfVar11 - fVar13) * fVar156;
        auVar91._4_4_ = (pfVar11[1] - fVar13) * fVar156;
        auVar91._8_4_ = (pfVar11[2] - fVar13) * fVar156;
        auVar91._12_4_ = (pfVar11[3] - fVar13) * fVar156;
        auVar71 = minps(auVar72,auVar91);
        pfVar11 = (float *)(uVar40 + 0x20 + (uVar42 ^ 0x10));
        auVar92._0_4_ = (*pfVar11 - fVar14) * fVar167;
        auVar92._4_4_ = (pfVar11[1] - fVar14) * fVar167;
        auVar92._8_4_ = (pfVar11[2] - fVar14) * fVar167;
        auVar92._12_4_ = (pfVar11[3] - fVar14) * fVar167;
        auVar93 = minps(auVar92,auVar119);
        auVar93 = minps(auVar71,auVar93);
        auVar71._4_4_ = -(uint)(auVar54._4_4_ <= auVar93._4_4_);
        auVar71._0_4_ = -(uint)(auVar54._0_4_ <= auVar93._0_4_);
        auVar71._8_4_ = -(uint)(auVar54._8_4_ <= auVar93._8_4_);
        auVar71._12_4_ = -(uint)(auVar54._12_4_ <= auVar93._12_4_);
        uVar45 = movmskps((int)unaff_R12,auVar71);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar45);
      }
      if ((uVar40 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar48 = 4;
        }
        else {
          uVar39 = uVar40 & 0xfffffffffffffff0;
          lVar37 = 0;
          if (unaff_R12 != 0) {
            for (; (unaff_R12 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar48 = 0;
          uVar40 = *(ulong *)(uVar39 + lVar37 * 8);
          uVar38 = unaff_R12 - 1 & unaff_R12;
          if (uVar38 != 0) {
            pNVar50->ptr = uVar40;
            lVar37 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar47 = uVar38 - 1;
            while( true ) {
              pNVar50 = pNVar50 + 1;
              uVar40 = *(ulong *)(uVar39 + lVar37 * 8);
              uVar47 = uVar47 & uVar38;
              if (uVar47 == 0) break;
              pNVar50->ptr = uVar40;
              lVar37 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              uVar38 = uVar47 - 1;
            }
          }
        }
      }
      else {
        uVar48 = 6;
      }
    } while (uVar48 == 0);
    if (uVar48 == 6) {
      uVar39 = (ulong)((uint)uVar40 & 0xf);
      uVar48 = 0;
      uVar38 = uVar39 - 8;
      bVar51 = uVar39 != 8;
      if (bVar51) {
        uVar39 = 0;
        local_b60 = pNVar50;
        do {
          pSVar17 = context->scene;
          puVar1 = (uint *)((uVar40 & 0xfffffffffffffff0) + uVar39 * 0x60);
          local_b48 = puVar1 + 0x10;
          scene._0_4_ = SUB84(pSVar17,0);
          scene._4_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
          ppfVar18 = (pSVar17->vertices).items;
          pfVar19 = ppfVar18[*local_b48];
          pfVar11 = pfVar19 + *puVar1;
          pfVar2 = pfVar19 + puVar1[4];
          pfVar3 = pfVar19 + puVar1[0xc];
          fVar102 = *pfVar3;
          fVar126 = pfVar3[1];
          fVar103 = pfVar3[2];
          pfVar20 = ppfVar18[puVar1[0x11]];
          pfVar3 = pfVar20 + puVar1[1];
          pfVar4 = pfVar20 + puVar1[5];
          pfVar5 = pfVar20 + puVar1[0xd];
          fVar110 = *pfVar5;
          fVar129 = pfVar5[1];
          fVar111 = pfVar5[2];
          pfVar21 = ppfVar18[puVar1[0x12]];
          pfVar5 = pfVar21 + puVar1[2];
          pfVar6 = pfVar21 + puVar1[6];
          local_7e8 = pfVar6[2];
          pfVar7 = pfVar21 + puVar1[0xe];
          fVar130 = pfVar7[1];
          fVar114 = pfVar7[2];
          pfVar22 = ppfVar18[puVar1[0x13]];
          pfVar8 = pfVar22 + puVar1[3];
          pfVar9 = pfVar22 + puVar1[7];
          fStack_7e4 = pfVar9[2];
          pfVar10 = pfVar22 + puVar1[0xf];
          fVar131 = pfVar10[1];
          fVar117 = pfVar10[2];
          fVar68 = *(float *)(ray + k * 4);
          fVar100 = *(float *)(ray + k * 4 + 0x10);
          fVar89 = *(float *)(ray + k * 4 + 0x20);
          fVar191 = *pfVar11 - fVar68;
          fVar195 = *pfVar3 - fVar68;
          fVar197 = *pfVar5 - fVar68;
          fVar199 = *pfVar8 - fVar68;
          fVar182 = pfVar11[1] - fVar100;
          fVar184 = pfVar3[1] - fVar100;
          fVar186 = pfVar5[1] - fVar100;
          fVar188 = pfVar8[1] - fVar100;
          fVar173 = pfVar11[2] - fVar89;
          fVar175 = pfVar3[2] - fVar89;
          fVar177 = pfVar5[2] - fVar89;
          fVar179 = pfVar8[2] - fVar89;
          local_808 = CONCAT44(*pfVar4,*pfVar2);
          fVar101 = *pfVar2 - fVar68;
          fVar109 = *pfVar4 - fVar68;
          fVar112 = *pfVar6 - fVar68;
          fVar115 = *pfVar9 - fVar68;
          local_818 = pfVar2[1];
          fStack_814 = pfVar4[1];
          fStack_810 = pfVar6[1];
          fStack_80c = pfVar9[1];
          fVar118 = pfVar2[1] - fVar100;
          fVar122 = pfVar4[1] - fVar100;
          fVar123 = pfVar6[1] - fVar100;
          fVar124 = pfVar9[1] - fVar100;
          local_7f8 = CONCAT44(pfVar4[2],pfVar2[2]);
          fVar125 = pfVar2[2] - fVar89;
          fVar128 = pfVar4[2] - fVar89;
          fStack_b40 = local_7e8 - fVar89;
          fStack_b3c = fStack_7e4 - fVar89;
          fVar53 = fVar102 - fVar68;
          fVar66 = fVar110 - fVar68;
          fVar67 = *pfVar7 - fVar68;
          fVar68 = *pfVar10 - fVar68;
          fVar90 = fVar126 - fVar100;
          fVar98 = fVar129 - fVar100;
          fVar99 = fVar130 - fVar100;
          fVar100 = fVar131 - fVar100;
          fVar69 = fVar103 - fVar89;
          fVar87 = fVar111 - fVar89;
          fVar88 = fVar114 - fVar89;
          fVar89 = fVar117 - fVar89;
          fVar152 = fVar53 - fVar191;
          fVar153 = fVar66 - fVar195;
          fVar154 = fVar67 - fVar197;
          fVar155 = fVar68 - fVar199;
          fVar168 = fVar90 - fVar182;
          fVar169 = fVar98 - fVar184;
          fVar170 = fVar99 - fVar186;
          fVar171 = fVar100 - fVar188;
          fVar157 = fVar69 - fVar173;
          fVar161 = fVar87 - fVar175;
          fVar163 = fVar88 - fVar177;
          fVar165 = fVar89 - fVar179;
          fVar113 = *(float *)(ray + k * 4 + 0x50);
          fVar116 = *(float *)(ray + k * 4 + 0x60);
          fVar147 = *(float *)(ray + k * 4 + 0x40);
          fVar132 = (fVar168 * (fVar69 + fVar173) - (fVar90 + fVar182) * fVar157) * fVar147 +
                    ((fVar53 + fVar191) * fVar157 - (fVar69 + fVar173) * fVar152) * fVar113 +
                    (fVar152 * (fVar90 + fVar182) - (fVar53 + fVar191) * fVar168) * fVar116;
          fVar136 = (fVar169 * (fVar87 + fVar175) - (fVar98 + fVar184) * fVar161) * fVar147 +
                    ((fVar66 + fVar195) * fVar161 - (fVar87 + fVar175) * fVar153) * fVar113 +
                    (fVar153 * (fVar98 + fVar184) - (fVar66 + fVar195) * fVar169) * fVar116;
          auVar133._0_8_ = CONCAT44(fVar136,fVar132);
          auVar133._8_4_ =
               (fVar170 * (fVar88 + fVar177) - (fVar99 + fVar186) * fVar163) * fVar147 +
               ((fVar67 + fVar197) * fVar163 - (fVar88 + fVar177) * fVar154) * fVar113 +
               (fVar154 * (fVar99 + fVar186) - (fVar67 + fVar197) * fVar170) * fVar116;
          auVar133._12_4_ =
               (fVar171 * (fVar89 + fVar179) - (fVar100 + fVar188) * fVar165) * fVar147 +
               ((fVar68 + fVar199) * fVar165 - (fVar89 + fVar179) * fVar155) * fVar113 +
               (fVar155 * (fVar100 + fVar188) - (fVar68 + fVar199) * fVar171) * fVar116;
          fVar141 = fVar191 - fVar101;
          fVar144 = fVar195 - fVar109;
          fVar145 = fVar197 - fVar112;
          fVar146 = fVar199 - fVar115;
          fVar158 = fVar182 - fVar118;
          fVar162 = fVar184 - fVar122;
          fVar164 = fVar186 - fVar123;
          fVar166 = fVar188 - fVar124;
          fVar137 = fVar173 - fVar125;
          fVar138 = fVar175 - fVar128;
          fVar139 = fVar177 - fStack_b40;
          fVar140 = fVar179 - fStack_b3c;
          auVar148._0_4_ =
               (fVar158 * (fVar173 + fVar125) - (fVar182 + fVar118) * fVar137) * fVar147 +
               ((fVar191 + fVar101) * fVar137 - (fVar173 + fVar125) * fVar141) * fVar113 +
               (fVar141 * (fVar182 + fVar118) - (fVar191 + fVar101) * fVar158) * fVar116;
          auVar148._4_4_ =
               (fVar162 * (fVar175 + fVar128) - (fVar184 + fVar122) * fVar138) * fVar147 +
               ((fVar195 + fVar109) * fVar138 - (fVar175 + fVar128) * fVar144) * fVar113 +
               (fVar144 * (fVar184 + fVar122) - (fVar195 + fVar109) * fVar162) * fVar116;
          auVar148._8_4_ =
               (fVar164 * (fVar177 + fStack_b40) - (fVar186 + fVar123) * fVar139) * fVar147 +
               ((fVar197 + fVar112) * fVar139 - (fVar177 + fStack_b40) * fVar145) * fVar113 +
               (fVar145 * (fVar186 + fVar123) - (fVar197 + fVar112) * fVar164) * fVar116;
          auVar148._12_4_ =
               (fVar166 * (fVar179 + fStack_b3c) - (fVar188 + fVar124) * fVar140) * fVar147 +
               ((fVar199 + fVar115) * fVar140 - (fVar179 + fStack_b3c) * fVar146) * fVar113 +
               (fVar146 * (fVar188 + fVar124) - (fVar199 + fVar115) * fVar166) * fVar116;
          fVar192 = fVar101 - fVar53;
          fVar196 = fVar109 - fVar66;
          fVar198 = fVar112 - fVar67;
          fVar200 = fVar115 - fVar68;
          fVar174 = fVar118 - fVar90;
          fVar176 = fVar122 - fVar98;
          fVar178 = fVar123 - fVar99;
          fVar180 = fVar124 - fVar100;
          fVar183 = fVar125 - fVar69;
          fVar185 = fVar128 - fVar87;
          fVar187 = fStack_b40 - fVar88;
          fVar189 = fStack_b3c - fVar89;
          auVar105._0_4_ =
               (fVar174 * (fVar69 + fVar125) - (fVar90 + fVar118) * fVar183) * fVar147 +
               ((fVar53 + fVar101) * fVar183 - (fVar69 + fVar125) * fVar192) * fVar113 +
               (fVar192 * (fVar90 + fVar118) - (fVar53 + fVar101) * fVar174) * fVar116;
          auVar105._4_4_ =
               (fVar176 * (fVar87 + fVar128) - (fVar98 + fVar122) * fVar185) * fVar147 +
               ((fVar66 + fVar109) * fVar185 - (fVar87 + fVar128) * fVar196) * fVar113 +
               (fVar196 * (fVar98 + fVar122) - (fVar66 + fVar109) * fVar176) * fVar116;
          auVar105._8_4_ =
               (fVar178 * (fVar88 + fStack_b40) - (fVar99 + fVar123) * fVar187) * fVar147 +
               ((fVar67 + fVar112) * fVar187 - (fVar88 + fStack_b40) * fVar198) * fVar113 +
               (fVar198 * (fVar99 + fVar123) - (fVar67 + fVar112) * fVar178) * fVar116;
          auVar105._12_4_ =
               (fVar180 * (fVar89 + fStack_b3c) - (fVar100 + fVar124) * fVar189) * fVar147 +
               ((fVar68 + fVar115) * fVar189 - (fVar89 + fStack_b3c) * fVar200) * fVar113 +
               (fVar200 * (fVar100 + fVar124) - (fVar68 + fVar115) * fVar180) * fVar116;
          fVar68 = fVar132 + auVar148._0_4_ + auVar105._0_4_;
          fVar89 = fVar136 + auVar148._4_4_ + auVar105._4_4_;
          fVar66 = auVar133._8_4_ + auVar148._8_4_ + auVar105._8_4_;
          fVar69 = auVar133._12_4_ + auVar148._12_4_ + auVar105._12_4_;
          auVar55._8_4_ = auVar133._8_4_;
          auVar55._0_8_ = auVar133._0_8_;
          auVar55._12_4_ = auVar133._12_4_;
          auVar54 = minps(auVar55,auVar148);
          auVar54 = minps(auVar54,auVar105);
          auVar71 = maxps(auVar133,auVar148);
          auVar71 = maxps(auVar71,auVar105);
          fVar100 = ABS(fVar68) * 1.1920929e-07;
          fVar53 = ABS(fVar89) * 1.1920929e-07;
          fVar67 = ABS(fVar66) * 1.1920929e-07;
          fVar87 = ABS(fVar69) * 1.1920929e-07;
          auVar134._4_4_ = -(uint)(auVar71._4_4_ <= fVar53);
          auVar134._0_4_ = -(uint)(auVar71._0_4_ <= fVar100);
          auVar134._8_4_ = -(uint)(auVar71._8_4_ <= fVar67);
          auVar134._12_4_ = -(uint)(auVar71._12_4_ <= fVar87);
          auVar56._4_4_ = -(uint)(-fVar53 <= auVar54._4_4_);
          auVar56._0_4_ = -(uint)(-fVar100 <= auVar54._0_4_);
          auVar56._8_4_ = -(uint)(-fVar67 <= auVar54._8_4_);
          auVar56._12_4_ = -(uint)(-fVar87 <= auVar54._12_4_);
          auVar134 = auVar134 | auVar56;
          local_b30 = (uVar40 & 0xfffffffffffffff0) + uVar39 * 0x60;
          uVar35 = puVar1[8];
          iVar43 = movmskps((int)local_b48,auVar134);
          uVar31 = *(undefined8 *)(pfVar19 + uVar35);
          uVar32 = *(undefined8 *)(pfVar19 + uVar35 + 2);
          local_828 = *(undefined8 *)(pfVar20 + puVar1[9]);
          uStack_820 = *(undefined8 *)(pfVar20 + puVar1[9] + 2);
          local_848 = *(undefined8 *)(pfVar21 + puVar1[10]);
          uStack_840 = *(undefined8 *)(pfVar21 + puVar1[10] + 2);
          local_838 = *(undefined8 *)(pfVar22 + puVar1[0xb]);
          uStack_830 = *(undefined8 *)(pfVar22 + puVar1[0xb] + 2);
          if (iVar43 != 0) {
            auVar159._0_4_ = fVar158 * fVar183 - fVar174 * fVar137;
            auVar159._4_4_ = fVar162 * fVar185 - fVar176 * fVar138;
            auVar159._8_4_ = fVar164 * fVar187 - fVar178 * fVar139;
            auVar159._12_4_ = fVar166 * fVar189 - fVar180 * fVar140;
            auVar57._4_4_ = -(uint)(ABS(fVar162 * fVar161) < ABS(fVar176 * fVar138));
            auVar57._0_4_ = -(uint)(ABS(fVar158 * fVar157) < ABS(fVar174 * fVar137));
            auVar57._8_4_ = -(uint)(ABS(fVar164 * fVar163) < ABS(fVar178 * fVar139));
            auVar57._12_4_ = -(uint)(ABS(fVar166 * fVar165) < ABS(fVar180 * fVar140));
            auVar28._4_4_ = fVar169 * fVar138 - fVar162 * fVar161;
            auVar28._0_4_ = fVar168 * fVar137 - fVar158 * fVar157;
            auVar28._8_4_ = fVar170 * fVar139 - fVar164 * fVar163;
            auVar28._12_4_ = fVar171 * fVar140 - fVar166 * fVar165;
            local_928 = blendvps(auVar159,auVar28,auVar57);
            auVar149._0_4_ = fVar157 * fVar141 - fVar152 * fVar137;
            auVar149._4_4_ = fVar161 * fVar144 - fVar153 * fVar138;
            auVar149._8_4_ = fVar163 * fVar145 - fVar154 * fVar139;
            auVar149._12_4_ = fVar165 * fVar146 - fVar155 * fVar140;
            auVar193._0_4_ = fVar192 * fVar137 - fVar141 * fVar183;
            auVar193._4_4_ = fVar196 * fVar138 - fVar144 * fVar185;
            auVar193._8_4_ = fVar198 * fVar139 - fVar145 * fVar187;
            auVar193._12_4_ = fVar200 * fVar140 - fVar146 * fVar189;
            auVar58._4_4_ = -(uint)(ABS(fVar153 * fVar138) < ABS(fVar144 * fVar185));
            auVar58._0_4_ = -(uint)(ABS(fVar152 * fVar137) < ABS(fVar141 * fVar183));
            auVar58._8_4_ = -(uint)(ABS(fVar154 * fVar139) < ABS(fVar145 * fVar187));
            auVar58._12_4_ = -(uint)(ABS(fVar155 * fVar140) < ABS(fVar146 * fVar189));
            local_918 = blendvps(auVar193,auVar149,auVar58);
            auVar142._0_4_ = fVar141 * fVar174 - fVar192 * fVar158;
            auVar142._4_4_ = fVar144 * fVar176 - fVar196 * fVar162;
            auVar142._8_4_ = fVar145 * fVar178 - fVar198 * fVar164;
            auVar142._12_4_ = fVar146 * fVar180 - fVar200 * fVar166;
            auVar59._4_4_ = -(uint)(ABS(fVar144 * fVar169) < ABS(fVar196 * fVar162));
            auVar59._0_4_ = -(uint)(ABS(fVar141 * fVar168) < ABS(fVar192 * fVar158));
            auVar59._8_4_ = -(uint)(ABS(fVar145 * fVar170) < ABS(fVar198 * fVar164));
            auVar59._12_4_ = -(uint)(ABS(fVar146 * fVar171) < ABS(fVar200 * fVar166));
            auVar30._4_4_ = fVar153 * fVar162 - fVar144 * fVar169;
            auVar30._0_4_ = fVar152 * fVar158 - fVar141 * fVar168;
            auVar30._8_4_ = fVar154 * fVar164 - fVar145 * fVar170;
            auVar30._12_4_ = fVar155 * fVar166 - fVar146 * fVar171;
            local_908 = blendvps(auVar142,auVar30,auVar59);
            fVar90 = fVar147 * local_928._0_4_ +
                     fVar113 * local_918._0_4_ + fVar116 * local_908._0_4_;
            fVar98 = fVar147 * local_928._4_4_ +
                     fVar113 * local_918._4_4_ + fVar116 * local_908._4_4_;
            fVar99 = fVar147 * local_928._8_4_ +
                     fVar113 * local_918._8_4_ + fVar116 * local_908._8_4_;
            fVar101 = fVar147 * local_928._12_4_ +
                      fVar113 * local_918._12_4_ + fVar116 * local_908._12_4_;
            fVar90 = fVar90 + fVar90;
            fVar98 = fVar98 + fVar98;
            fVar99 = fVar99 + fVar99;
            fVar101 = fVar101 + fVar101;
            auVar73._0_4_ = fVar182 * local_918._0_4_ + fVar173 * local_908._0_4_;
            auVar73._4_4_ = fVar184 * local_918._4_4_ + fVar175 * local_908._4_4_;
            auVar73._8_4_ = fVar186 * local_918._8_4_ + fVar177 * local_908._8_4_;
            auVar73._12_4_ = fVar188 * local_918._12_4_ + fVar179 * local_908._12_4_;
            fVar53 = fVar191 * local_928._0_4_ + auVar73._0_4_;
            fVar67 = fVar195 * local_928._4_4_ + auVar73._4_4_;
            fVar87 = fVar197 * local_928._8_4_ + auVar73._8_4_;
            fVar88 = fVar199 * local_928._12_4_ + auVar73._12_4_;
            auVar29._4_4_ = fVar98;
            auVar29._0_4_ = fVar90;
            auVar29._8_4_ = fVar99;
            auVar29._12_4_ = fVar101;
            auVar54 = rcpps(auVar73,auVar29);
            fVar100 = auVar54._0_4_;
            fVar113 = auVar54._4_4_;
            fVar116 = auVar54._8_4_;
            fVar147 = auVar54._12_4_;
            local_938._0_4_ = ((1.0 - fVar90 * fVar100) * fVar100 + fVar100) * (fVar53 + fVar53);
            local_938._4_4_ = ((1.0 - fVar98 * fVar113) * fVar113 + fVar113) * (fVar67 + fVar67);
            fStack_930 = ((1.0 - fVar99 * fVar116) * fVar116 + fVar116) * (fVar87 + fVar87);
            fStack_92c = ((1.0 - fVar101 * fVar147) * fVar147 + fVar147) * (fVar88 + fVar88);
            fVar100 = *(float *)(ray + k * 4 + 0x80);
            fVar113 = *(float *)(ray + k * 4 + 0x30);
            auVar94._4_4_ = -(uint)(fVar113 <= (float)local_938._4_4_);
            auVar94._0_4_ = -(uint)(fVar113 <= (float)local_938._0_4_);
            auVar94._8_4_ = -(uint)(fVar113 <= fStack_930);
            auVar94._12_4_ = -(uint)(fVar113 <= fStack_92c);
            auVar74._0_4_ =
                 -(uint)((float)local_938._0_4_ <= fVar100 && fVar113 <= (float)local_938._0_4_) &
                 auVar134._0_4_;
            auVar74._4_4_ =
                 -(uint)((float)local_938._4_4_ <= fVar100 && fVar113 <= (float)local_938._4_4_) &
                 auVar134._4_4_;
            auVar74._8_4_ = -(uint)(fStack_930 <= fVar100 && fVar113 <= fStack_930) & auVar134._8_4_
            ;
            auVar74._12_4_ =
                 -(uint)(fStack_92c <= fVar100 && fVar113 <= fStack_92c) & auVar134._12_4_;
            uVar35 = movmskps(uVar35,auVar74);
            if ((uVar35 != 0) &&
               (auVar75._0_4_ = auVar74._0_4_ & -(uint)(fVar90 != 0.0),
               auVar75._4_4_ = auVar74._4_4_ & -(uint)(fVar98 != 0.0),
               auVar75._8_4_ = auVar74._8_4_ & -(uint)(fVar99 != 0.0),
               auVar75._12_4_ = auVar74._12_4_ & -(uint)(fVar101 != 0.0),
               uVar35 = movmskps(uVar35,auVar75), uVar35 != 0)) {
              auVar33._4_4_ = fVar89;
              auVar33._0_4_ = fVar68;
              auVar33._8_4_ = fVar66;
              auVar33._12_4_ = fVar69;
              local_8f8._4_4_ = fStack_7e4;
              local_8f8._0_4_ = local_7e8;
              local_8f8._8_8_ = uStack_7e0;
              auVar54 = rcpps(auVar94,auVar33);
              fVar113 = auVar54._0_4_;
              fVar116 = auVar54._4_4_;
              fVar147 = auVar54._8_4_;
              fVar53 = auVar54._12_4_;
              fVar67 = (float)DAT_01feca10;
              fVar87 = DAT_01feca10._4_4_;
              fVar88 = DAT_01feca10._12_4_;
              fVar100 = DAT_01feca10._8_4_;
              fVar68 = (float)(-(uint)(1e-18 <= ABS(fVar68)) &
                              (uint)((fVar67 - fVar68 * fVar113) * fVar113 + fVar113));
              fVar89 = (float)(-(uint)(1e-18 <= ABS(fVar89)) &
                              (uint)((fVar87 - fVar89 * fVar116) * fVar116 + fVar116));
              fVar113 = (float)(-(uint)(1e-18 <= ABS(fVar66)) &
                               (uint)((fVar100 - fVar66 * fVar147) * fVar147 + fVar147));
              fVar116 = (float)(-(uint)(1e-18 <= ABS(fVar69)) &
                               (uint)((fVar88 - fVar69 * fVar53) * fVar53 + fVar53));
              auVar150._0_4_ = fVar132 * fVar68;
              auVar150._4_4_ = fVar136 * fVar89;
              auVar150._8_4_ = auVar133._8_4_ * fVar113;
              auVar150._12_4_ = auVar133._12_4_ * fVar116;
              auVar71 = minps(auVar150,_DAT_01feca10);
              auVar106._0_4_ = fVar68 * auVar148._0_4_;
              auVar106._4_4_ = fVar89 * auVar148._4_4_;
              auVar106._8_4_ = fVar113 * auVar148._8_4_;
              auVar106._12_4_ = fVar116 * auVar148._12_4_;
              auVar54 = minps(auVar106,_DAT_01feca10);
              auVar76._0_4_ = fVar67 - auVar71._0_4_;
              auVar76._4_4_ = fVar87 - auVar71._4_4_;
              auVar76._8_4_ = fVar100 - auVar71._8_4_;
              auVar76._12_4_ = fVar88 - auVar71._12_4_;
              auVar95._0_4_ = fVar67 - auVar54._0_4_;
              auVar95._4_4_ = fVar87 - auVar54._4_4_;
              auVar95._8_4_ = fVar100 - auVar54._8_4_;
              auVar95._12_4_ = fVar88 - auVar54._12_4_;
              local_958 = blendvps(auVar71,auVar76,local_8f8);
              local_948 = blendvps(auVar54,auVar95,local_8f8);
              uVar47 = (ulong)(byte)uVar35;
              do {
                uVar46 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                local_888 = local_b48[uVar46];
                lVar37 = *(long *)(*(long *)(CONCAT44(scene._4_4_,scene._0_4_) + 0x1e8) +
                                  (ulong)local_888 * 8);
                if ((*(uint *)(lVar37 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                  uVar35 = (uint)CONCAT71((uint7)(uint3)(*(uint *)(ray + k * 4 + 0x90) >> 8),1);
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (*(long *)(lVar37 + 0x48) == 0)) {
                  uVar35 = 0;
                }
                else {
                  uVar45 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_8b8 = *(undefined4 *)(local_958 + uVar46 * 4);
                  uVar15 = *(undefined4 *)(local_948 + uVar46 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_938 + uVar46 * 4);
                  args.context = context->user;
                  local_898 = *(undefined4 *)(local_b30 + 0x50 + uVar46 * 4);
                  local_8a8._4_4_ = uVar15;
                  local_8a8._0_4_ = uVar15;
                  local_8a8._8_4_ = uVar15;
                  local_8a8._12_4_ = uVar15;
                  local_8e8 = *(undefined4 *)(local_928 + uVar46 * 4);
                  uVar15 = *(undefined4 *)(local_918 + uVar46 * 4);
                  uVar16 = *(undefined4 *)(local_908 + uVar46 * 4);
                  local_8d8._4_4_ = uVar15;
                  local_8d8._0_4_ = uVar15;
                  local_8d8._8_4_ = uVar15;
                  local_8d8._12_4_ = uVar15;
                  local_8c8._4_4_ = uVar16;
                  local_8c8._0_4_ = uVar16;
                  local_8c8._8_4_ = uVar16;
                  local_8c8._12_4_ = uVar16;
                  uStack_8e4 = local_8e8;
                  uStack_8e0 = local_8e8;
                  uStack_8dc = local_8e8;
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  uStack_894 = local_898;
                  uStack_890 = local_898;
                  uStack_88c = local_898;
                  uStack_884 = local_888;
                  uStack_880 = local_888;
                  uStack_87c = local_888;
                  local_878 = (args.context)->instID[0];
                  uStack_874 = local_878;
                  uStack_870 = local_878;
                  uStack_86c = local_878;
                  local_868 = (args.context)->instPrimID[0];
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  local_b78 = *local_b38;
                  args.valid = (int *)local_b78;
                  args.geometryUserPtr = *(void **)(lVar37 + 0x18);
                  args.hit = (RTCHitN *)&local_8e8;
                  args.N = 4;
                  pRVar36 = *(RTCRayN **)(lVar37 + 0x48);
                  args.ray = (RTCRayN *)ray;
                  if (pRVar36 != (RTCRayN *)0x0) {
                    pRVar36 = (RTCRayN *)(*(code *)pRVar36)(&args);
                  }
                  if (local_b78 == (undefined1  [16])0x0) {
                    auVar77._8_4_ = 0xffffffff;
                    auVar77._0_8_ = 0xffffffffffffffff;
                    auVar77._12_4_ = 0xffffffff;
                    auVar77 = auVar77 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar37 + 0x3e) & 0x40) != 0)))
                       ) {
                      (*p_Var23)(&args);
                    }
                    auVar60._0_4_ = -(uint)(local_b78._0_4_ == 0);
                    auVar60._4_4_ = -(uint)(local_b78._4_4_ == 0);
                    auVar60._8_4_ = -(uint)(local_b78._8_4_ == 0);
                    auVar60._12_4_ = -(uint)(local_b78._12_4_ == 0);
                    auVar77 = auVar60 ^ _DAT_01febe20;
                    auVar54 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar60
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
                    pRVar36 = args.ray;
                  }
                  auVar78._0_4_ = auVar77._0_4_ << 0x1f;
                  auVar78._4_4_ = auVar77._4_4_ << 0x1f;
                  auVar78._8_4_ = auVar77._8_4_ << 0x1f;
                  auVar78._12_4_ = auVar77._12_4_ << 0x1f;
                  iVar43 = movmskps((int)pRVar36,auVar78);
                  uVar35 = CONCAT31((int3)((uint)iVar43 >> 8),iVar43 == 0);
                  if (iVar43 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar45;
                    uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                  }
                }
                if ((char)uVar35 == '\0') goto LAB_00296150;
                uVar46 = local_b68;
                pNVar50 = local_b60;
              } while (uVar47 != 0);
            }
          }
          local_af8 = (float)uVar31;
          fStack_af4 = (float)((ulong)uVar31 >> 0x20);
          fStack_af0 = (float)uVar32;
          fVar68 = *(float *)(ray + k * 4);
          fVar100 = *(float *)(ray + k * 4 + 0x10);
          fVar89 = *(float *)(ray + k * 4 + 0x20);
          local_af8 = local_af8 - fVar68;
          fVar187 = (float)local_828 - fVar68;
          fVar188 = (float)local_848 - fVar68;
          fVar189 = (float)local_838 - fVar68;
          fStack_af4 = fStack_af4 - fVar100;
          fVar137 = local_828._4_4_ - fVar100;
          fVar139 = local_848._4_4_ - fVar100;
          fVar141 = local_838._4_4_ - fVar100;
          fStack_af0 = fStack_af0 - fVar89;
          fVar146 = (float)uStack_820 - fVar89;
          fVar153 = (float)uStack_840 - fVar89;
          fVar155 = (float)uStack_830 - fVar89;
          fVar102 = fVar102 - fVar68;
          fVar110 = fVar110 - fVar68;
          fStack_ae0 = fStack_ae0 - fVar68;
          fStack_adc = fStack_adc - fVar68;
          fVar126 = fVar126 - fVar100;
          fVar129 = fVar129 - fVar100;
          fVar130 = fVar130 - fVar100;
          fVar131 = fVar131 - fVar100;
          fVar103 = fVar103 - fVar89;
          fVar111 = fVar111 - fVar89;
          fVar114 = fVar114 - fVar89;
          fVar117 = fVar117 - fVar89;
          fVar176 = (float)local_808 - fVar68;
          fVar177 = local_808._4_4_ - fVar68;
          fVar178 = fStack_800 - fVar68;
          fVar68 = fStack_7fc - fVar68;
          fVar184 = local_818 - fVar100;
          fVar185 = fStack_814 - fVar100;
          fVar186 = fStack_810 - fVar100;
          fVar100 = fStack_80c - fVar100;
          fVar147 = (float)local_7f8 - fVar89;
          fVar158 = local_7f8._4_4_ - fVar89;
          fVar161 = fStack_7f0 - fVar89;
          fVar89 = fStack_7ec - fVar89;
          fVar124 = fVar176 - local_af8;
          fVar125 = fVar177 - fVar187;
          fVar128 = fVar178 - fVar188;
          fVar132 = fVar68 - fVar189;
          fVar171 = fVar184 - fStack_af4;
          fVar173 = fVar185 - fVar137;
          fVar174 = fVar186 - fVar139;
          fVar175 = fVar100 - fVar141;
          fVar162 = fVar147 - fStack_af0;
          fVar164 = fVar158 - fVar146;
          fVar166 = fVar161 - fVar153;
          fVar169 = fVar89 - fVar155;
          fStack_b50 = *(float *)(ray + k * 4 + 0x50);
          fVar113 = *(float *)(ray + k * 4 + 0x60);
          fVar116 = *(float *)(ray + k * 4 + 0x40);
          fVar179 = (fVar171 * (fVar147 + fStack_af0) - (fVar184 + fStack_af4) * fVar162) * fVar116
                    + ((fVar176 + local_af8) * fVar162 - (fVar147 + fStack_af0) * fVar124) *
                      fStack_b50 +
                      (fVar124 * (fVar184 + fStack_af4) - (fVar176 + local_af8) * fVar171) * fVar113
          ;
          fVar180 = (fVar173 * (fVar158 + fVar146) - (fVar185 + fVar137) * fVar164) * fVar116 +
                    ((fVar177 + fVar187) * fVar164 - (fVar158 + fVar146) * fVar125) * fStack_b50 +
                    (fVar125 * (fVar185 + fVar137) - (fVar177 + fVar187) * fVar173) * fVar113;
          fVar182 = (fVar174 * (fVar161 + fVar153) - (fVar186 + fVar139) * fVar166) * fVar116 +
                    ((fVar178 + fVar188) * fVar166 - (fVar161 + fVar153) * fVar128) * fStack_b50 +
                    (fVar128 * (fVar186 + fVar139) - (fVar178 + fVar188) * fVar174) * fVar113;
          fVar183 = (fVar175 * (fVar89 + fVar155) - (fVar100 + fVar141) * fVar169) * fVar116 +
                    ((fVar68 + fVar189) * fVar169 - (fVar89 + fVar155) * fVar132) * fStack_b50 +
                    (fVar132 * (fVar100 + fVar141) - (fVar68 + fVar189) * fVar175) * fVar113;
          fVar53 = local_af8 - fVar102;
          fVar66 = fVar187 - fVar110;
          fVar67 = fVar188 - fStack_ae0;
          fVar69 = fVar189 - fStack_adc;
          fVar163 = fStack_af4 - fVar126;
          fVar165 = fVar137 - fVar129;
          fVar168 = fVar139 - fVar130;
          fVar170 = fVar141 - fVar131;
          fVar99 = fStack_af0 - fVar103;
          fVar109 = fVar146 - fVar111;
          fVar115 = fVar153 - fVar114;
          fVar122 = fVar155 - fVar117;
          fVar136 = (fVar163 * (fStack_af0 + fVar103) - (fStack_af4 + fVar126) * fVar99) * fVar116 +
                    ((local_af8 + fVar102) * fVar99 - (fStack_af0 + fVar103) * fVar53) * fStack_b50
                    + (fVar53 * (fStack_af4 + fVar126) - (local_af8 + fVar102) * fVar163) * fVar113;
          fVar138 = (fVar165 * (fVar146 + fVar111) - (fVar137 + fVar129) * fVar109) * fVar116 +
                    ((fVar187 + fVar110) * fVar109 - (fVar146 + fVar111) * fVar66) * fStack_b50 +
                    (fVar66 * (fVar137 + fVar129) - (fVar187 + fVar110) * fVar165) * fVar113;
          fVar140 = (fVar168 * (fVar153 + fVar114) - (fVar139 + fVar130) * fVar115) * fVar116 +
                    ((fVar188 + fStack_ae0) * fVar115 - (fVar153 + fVar114) * fVar67) * fStack_b50 +
                    (fVar67 * (fVar139 + fVar130) - (fVar188 + fStack_ae0) * fVar168) * fVar113;
          fVar144 = (fVar170 * (fVar155 + fVar117) - (fVar141 + fVar131) * fVar122) * fVar116 +
                    ((fVar189 + fStack_adc) * fVar122 - (fVar155 + fVar117) * fVar69) * fStack_b50 +
                    (fVar69 * (fVar141 + fVar131) - (fVar189 + fStack_adc) * fVar170) * fVar113;
          fVar101 = fVar102 - fVar176;
          fVar112 = fVar110 - fVar177;
          fVar118 = fStack_ae0 - fVar178;
          fVar123 = fStack_adc - fVar68;
          fVar145 = fVar126 - fVar184;
          fVar152 = fVar129 - fVar185;
          fVar154 = fVar130 - fVar186;
          fVar157 = fVar131 - fVar100;
          fVar87 = fVar103 - fVar147;
          fVar88 = fVar111 - fVar158;
          fVar90 = fVar114 - fVar161;
          fVar98 = fVar117 - fVar89;
          auVar61._0_4_ =
               (fVar145 * (fVar147 + fVar103) - (fVar184 + fVar126) * fVar87) * fVar116 +
               ((fVar176 + fVar102) * fVar87 - (fVar147 + fVar103) * fVar101) * fStack_b50 +
               (fVar101 * (fVar184 + fVar126) - (fVar176 + fVar102) * fVar145) * fVar113;
          auVar61._4_4_ =
               (fVar152 * (fVar158 + fVar111) - (fVar185 + fVar129) * fVar88) * fVar116 +
               ((fVar177 + fVar110) * fVar88 - (fVar158 + fVar111) * fVar112) * fStack_b50 +
               (fVar112 * (fVar185 + fVar129) - (fVar177 + fVar110) * fVar152) * fVar113;
          auVar61._8_4_ =
               (fVar154 * (fVar161 + fVar114) - (fVar186 + fVar130) * fVar90) * fVar116 +
               ((fVar178 + fStack_ae0) * fVar90 - (fVar161 + fVar114) * fVar118) * fStack_b50 +
               (fVar118 * (fVar186 + fVar130) - (fVar178 + fStack_ae0) * fVar154) * fVar113;
          auVar61._12_4_ =
               (fVar157 * (fVar89 + fVar117) - (fVar100 + fVar131) * fVar98) * fVar116 +
               ((fVar68 + fStack_adc) * fVar98 - (fVar89 + fVar117) * fVar123) * fStack_b50 +
               (fVar123 * (fVar100 + fVar131) - (fVar68 + fStack_adc) * fVar157) * fVar113;
          fVar102 = fVar179 + fVar136 + auVar61._0_4_;
          fVar126 = fVar180 + fVar138 + auVar61._4_4_;
          fVar103 = fVar182 + fVar140 + auVar61._8_4_;
          fVar110 = fVar183 + fVar144 + auVar61._12_4_;
          auVar79._4_4_ = fVar180;
          auVar79._0_4_ = fVar179;
          auVar79._8_4_ = fVar182;
          auVar79._12_4_ = fVar183;
          auVar24._4_4_ = fVar138;
          auVar24._0_4_ = fVar136;
          auVar24._8_4_ = fVar140;
          auVar24._12_4_ = fVar144;
          auVar54 = minps(auVar79,auVar24);
          auVar54 = minps(auVar54,auVar61);
          auVar107._4_4_ = fVar180;
          auVar107._0_4_ = fVar179;
          auVar107._8_4_ = fVar182;
          auVar107._12_4_ = fVar183;
          auVar25._4_4_ = fVar138;
          auVar25._0_4_ = fVar136;
          auVar25._8_4_ = fVar140;
          auVar25._12_4_ = fVar144;
          auVar71 = maxps(auVar107,auVar25);
          auVar71 = maxps(auVar71,auVar61);
          fVar68 = ABS(fVar102) * 1.1920929e-07;
          fVar100 = ABS(fVar126) * 1.1920929e-07;
          fVar89 = ABS(fVar103) * 1.1920929e-07;
          fVar147 = ABS(fVar110) * 1.1920929e-07;
          auVar108._4_4_ = -(uint)(auVar71._4_4_ <= fVar100);
          auVar108._0_4_ = -(uint)(auVar71._0_4_ <= fVar68);
          auVar108._8_4_ = -(uint)(auVar71._8_4_ <= fVar89);
          auVar108._12_4_ = -(uint)(auVar71._12_4_ <= fVar147);
          auVar80._4_4_ = -(uint)(-fVar100 <= auVar54._4_4_);
          auVar80._0_4_ = -(uint)(-fVar68 <= auVar54._0_4_);
          auVar80._8_4_ = -(uint)(-fVar89 <= auVar54._8_4_);
          auVar80._12_4_ = -(uint)(-fVar147 <= auVar54._12_4_);
          auVar108 = auVar108 | auVar80;
          iVar43 = movmskps(uVar35,auVar108);
          fStack_b4c = fStack_b50;
          if (iVar43 != 0) {
            auVar160._0_4_ = fVar171 * fVar99 - fVar163 * fVar162;
            auVar160._4_4_ = fVar173 * fVar109 - fVar165 * fVar164;
            auVar160._8_4_ = fVar174 * fVar115 - fVar168 * fVar166;
            auVar160._12_4_ = fVar175 * fVar122 - fVar170 * fVar169;
            auVar135._0_4_ = fVar163 * fVar87 - fVar145 * fVar99;
            auVar135._4_4_ = fVar165 * fVar88 - fVar152 * fVar109;
            auVar135._8_4_ = fVar168 * fVar90 - fVar154 * fVar115;
            auVar135._12_4_ = fVar170 * fVar98 - fVar157 * fVar122;
            auVar62._4_4_ = -(uint)(ABS(fVar165 * fVar164) < ABS(fVar152 * fVar109));
            auVar62._0_4_ = -(uint)(ABS(fVar163 * fVar162) < ABS(fVar145 * fVar99));
            auVar62._8_4_ = -(uint)(ABS(fVar168 * fVar166) < ABS(fVar154 * fVar115));
            auVar62._12_4_ = -(uint)(ABS(fVar170 * fVar169) < ABS(fVar157 * fVar122));
            local_928 = blendvps(auVar135,auVar160,auVar62);
            auVar127._0_4_ = fVar101 * fVar99 - fVar53 * fVar87;
            auVar127._4_4_ = fVar112 * fVar109 - fVar66 * fVar88;
            auVar127._8_4_ = fVar118 * fVar115 - fVar67 * fVar90;
            auVar127._12_4_ = fVar123 * fVar122 - fVar69 * fVar98;
            auVar63._4_4_ = -(uint)(ABS(fVar125 * fVar109) < ABS(fVar66 * fVar88));
            auVar63._0_4_ = -(uint)(ABS(fVar124 * fVar99) < ABS(fVar53 * fVar87));
            auVar63._8_4_ = -(uint)(ABS(fVar128 * fVar115) < ABS(fVar67 * fVar90));
            auVar63._12_4_ = -(uint)(ABS(fVar132 * fVar122) < ABS(fVar69 * fVar98));
            auVar26._4_4_ = fVar164 * fVar66 - fVar125 * fVar109;
            auVar26._0_4_ = fVar162 * fVar53 - fVar124 * fVar99;
            auVar26._8_4_ = fVar166 * fVar67 - fVar128 * fVar115;
            auVar26._12_4_ = fVar169 * fVar69 - fVar132 * fVar122;
            local_918 = blendvps(auVar127,auVar26,auVar63);
            auVar143._0_4_ = fVar124 * fVar163 - fVar53 * fVar171;
            auVar143._4_4_ = fVar125 * fVar165 - fVar66 * fVar173;
            auVar143._8_4_ = fVar128 * fVar168 - fVar67 * fVar174;
            auVar143._12_4_ = fVar132 * fVar170 - fVar69 * fVar175;
            auVar120._0_4_ = fVar53 * fVar145 - fVar101 * fVar163;
            auVar120._4_4_ = fVar66 * fVar152 - fVar112 * fVar165;
            auVar120._8_4_ = fVar67 * fVar154 - fVar118 * fVar168;
            auVar120._12_4_ = fVar69 * fVar157 - fVar123 * fVar170;
            auVar64._4_4_ = -(uint)(ABS(fVar66 * fVar173) < ABS(fVar112 * fVar165));
            auVar64._0_4_ = -(uint)(ABS(fVar53 * fVar171) < ABS(fVar101 * fVar163));
            auVar64._8_4_ = -(uint)(ABS(fVar67 * fVar174) < ABS(fVar118 * fVar168));
            auVar64._12_4_ = -(uint)(ABS(fVar69 * fVar175) < ABS(fVar123 * fVar170));
            local_908 = blendvps(auVar120,auVar143,auVar64);
            fVar130 = fVar116 * local_928._0_4_ +
                      fStack_b50 * local_918._0_4_ + fVar113 * local_908._0_4_;
            fVar114 = fVar116 * local_928._4_4_ +
                      fStack_b50 * local_918._4_4_ + fVar113 * local_908._4_4_;
            fVar131 = fVar116 * local_928._8_4_ +
                      fStack_b50 * local_918._8_4_ + fVar113 * local_908._8_4_;
            fVar117 = fVar116 * local_928._12_4_ +
                      fStack_b50 * local_918._12_4_ + fVar113 * local_908._12_4_;
            fVar130 = fVar130 + fVar130;
            fVar114 = fVar114 + fVar114;
            fVar131 = fVar131 + fVar131;
            fVar117 = fVar117 + fVar117;
            auVar81._0_4_ = fStack_af4 * local_918._0_4_ + fStack_af0 * local_908._0_4_;
            auVar81._4_4_ = fVar137 * local_918._4_4_ + fVar146 * local_908._4_4_;
            auVar81._8_4_ = fVar139 * local_918._8_4_ + fVar153 * local_908._8_4_;
            auVar81._12_4_ = fVar141 * local_918._12_4_ + fVar155 * local_908._12_4_;
            fVar116 = local_af8 * local_928._0_4_ + auVar81._0_4_;
            fVar147 = fVar187 * local_928._4_4_ + auVar81._4_4_;
            fVar129 = fVar188 * local_928._8_4_ + auVar81._8_4_;
            fVar111 = fVar189 * local_928._12_4_ + auVar81._12_4_;
            auVar27._4_4_ = fVar114;
            auVar27._0_4_ = fVar130;
            auVar27._8_4_ = fVar131;
            auVar27._12_4_ = fVar117;
            auVar54 = rcpps(auVar81,auVar27);
            fVar68 = auVar54._0_4_;
            fVar100 = auVar54._4_4_;
            fVar89 = auVar54._8_4_;
            fVar113 = auVar54._12_4_;
            local_938._0_4_ = ((1.0 - fVar130 * fVar68) * fVar68 + fVar68) * (fVar116 + fVar116);
            local_938._4_4_ = ((1.0 - fVar114 * fVar100) * fVar100 + fVar100) * (fVar147 + fVar147);
            fStack_930 = ((1.0 - fVar131 * fVar89) * fVar89 + fVar89) * (fVar129 + fVar129);
            fStack_92c = ((1.0 - fVar117 * fVar113) * fVar113 + fVar113) * (fVar111 + fVar111);
            fVar68 = *(float *)(ray + k * 4 + 0x80);
            fVar100 = *(float *)(ray + k * 4 + 0x30);
            auVar96._4_4_ = -(uint)(fVar100 <= (float)local_938._4_4_);
            auVar96._0_4_ = -(uint)(fVar100 <= (float)local_938._0_4_);
            auVar96._8_4_ = -(uint)(fVar100 <= fStack_930);
            auVar96._12_4_ = -(uint)(fVar100 <= fStack_92c);
            auVar82._0_4_ =
                 -(uint)((float)local_938._0_4_ <= fVar68 && fVar100 <= (float)local_938._0_4_) &
                 auVar108._0_4_;
            auVar82._4_4_ =
                 -(uint)((float)local_938._4_4_ <= fVar68 && fVar100 <= (float)local_938._4_4_) &
                 auVar108._4_4_;
            auVar82._8_4_ = -(uint)(fStack_930 <= fVar68 && fVar100 <= fStack_930) & auVar108._8_4_;
            auVar82._12_4_ =
                 -(uint)(fStack_92c <= fVar68 && fVar100 <= fStack_92c) & auVar108._12_4_;
            iVar43 = movmskps(iVar43,auVar82);
            if ((iVar43 != 0) &&
               (auVar83._0_4_ = auVar82._0_4_ & -(uint)(fVar130 != 0.0),
               auVar83._4_4_ = auVar82._4_4_ & -(uint)(fVar114 != 0.0),
               auVar83._8_4_ = auVar82._8_4_ & -(uint)(fVar131 != 0.0),
               auVar83._12_4_ = auVar82._12_4_ & -(uint)(fVar117 != 0.0),
               uVar35 = movmskps(iVar43,auVar83), uVar35 != 0)) {
              auVar34._4_4_ = fVar126;
              auVar34._0_4_ = fVar102;
              auVar34._8_4_ = fVar103;
              auVar34._12_4_ = fVar110;
              local_8f8 = local_858;
              scene._0_4_ = SUB84(context->scene,0);
              scene._4_4_ = (undefined4)((ulong)context->scene >> 0x20);
              auVar54 = rcpps(auVar96,auVar34);
              fVar89 = auVar54._0_4_;
              fVar113 = auVar54._4_4_;
              fVar116 = auVar54._8_4_;
              fVar147 = auVar54._12_4_;
              fVar129 = DAT_01feca10._4_4_;
              fVar111 = DAT_01feca10._12_4_;
              fVar68 = (float)DAT_01feca10;
              fVar100 = DAT_01feca10._8_4_;
              fVar89 = (float)(-(uint)(1e-18 <= ABS(fVar102)) &
                              (uint)((fVar68 - fVar102 * fVar89) * fVar89 + fVar89));
              fVar113 = (float)(-(uint)(1e-18 <= ABS(fVar126)) &
                               (uint)((fVar129 - fVar126 * fVar113) * fVar113 + fVar113));
              fVar116 = (float)(-(uint)(1e-18 <= ABS(fVar103)) &
                               (uint)((fVar100 - fVar103 * fVar116) * fVar116 + fVar116));
              fVar147 = (float)(-(uint)(1e-18 <= ABS(fVar110)) &
                               (uint)((fVar111 - fVar110 * fVar147) * fVar147 + fVar147));
              auVar121._0_4_ = fVar179 * fVar89;
              auVar121._4_4_ = fVar180 * fVar113;
              auVar121._8_4_ = fVar182 * fVar116;
              auVar121._12_4_ = fVar183 * fVar147;
              auVar54 = minps(auVar121,_DAT_01feca10);
              auVar194._0_4_ = fVar89 * fVar136;
              auVar194._4_4_ = fVar113 * fVar138;
              auVar194._8_4_ = fVar116 * fVar140;
              auVar194._12_4_ = fVar147 * fVar144;
              auVar71 = minps(auVar194,_DAT_01feca10);
              auVar84._0_4_ = fVar68 - auVar54._0_4_;
              auVar84._4_4_ = fVar129 - auVar54._4_4_;
              auVar84._8_4_ = fVar100 - auVar54._8_4_;
              auVar84._12_4_ = fVar111 - auVar54._12_4_;
              auVar97._0_4_ = fVar68 - auVar71._0_4_;
              auVar97._4_4_ = fVar129 - auVar71._4_4_;
              auVar97._8_4_ = fVar100 - auVar71._8_4_;
              auVar97._12_4_ = fVar111 - auVar71._12_4_;
              local_958 = blendvps(auVar54,auVar84,local_858);
              local_948 = blendvps(auVar71,auVar97,local_858);
              uVar47 = (ulong)(uVar35 & 0xff);
              do {
                uVar46 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                local_888 = local_b48[uVar46];
                lVar37 = *(long *)(*(long *)(CONCAT44(scene._4_4_,scene._0_4_) + 0x1e8) +
                                  (ulong)local_888 * 8);
                if ((*(uint *)(lVar37 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                  bVar52 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (*(long *)(lVar37 + 0x48) == 0)) {
                  bVar52 = false;
                }
                else {
                  uVar45 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_8b8 = *(undefined4 *)(local_958 + uVar46 * 4);
                  uVar15 = *(undefined4 *)(local_948 + uVar46 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_938 + uVar46 * 4);
                  args.context = context->user;
                  local_898 = *(undefined4 *)(local_b30 + 0x50 + uVar46 * 4);
                  local_8a8._4_4_ = uVar15;
                  local_8a8._0_4_ = uVar15;
                  local_8a8._8_4_ = uVar15;
                  local_8a8._12_4_ = uVar15;
                  local_8e8 = *(undefined4 *)(local_928 + uVar46 * 4);
                  uVar15 = *(undefined4 *)(local_918 + uVar46 * 4);
                  uVar16 = *(undefined4 *)(local_908 + uVar46 * 4);
                  local_8d8._4_4_ = uVar15;
                  local_8d8._0_4_ = uVar15;
                  local_8d8._8_4_ = uVar15;
                  local_8d8._12_4_ = uVar15;
                  local_8c8._4_4_ = uVar16;
                  local_8c8._0_4_ = uVar16;
                  local_8c8._8_4_ = uVar16;
                  local_8c8._12_4_ = uVar16;
                  uStack_8e4 = local_8e8;
                  uStack_8e0 = local_8e8;
                  uStack_8dc = local_8e8;
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  uStack_894 = local_898;
                  uStack_890 = local_898;
                  uStack_88c = local_898;
                  uStack_884 = local_888;
                  uStack_880 = local_888;
                  uStack_87c = local_888;
                  local_878 = (args.context)->instID[0];
                  uStack_874 = local_878;
                  uStack_870 = local_878;
                  uStack_86c = local_878;
                  local_868 = (args.context)->instPrimID[0];
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  local_b78 = *local_b38;
                  args.valid = (int *)local_b78;
                  args.geometryUserPtr = *(void **)(lVar37 + 0x18);
                  args.hit = (RTCHitN *)&local_8e8;
                  args.N = 4;
                  pRVar36 = *(RTCRayN **)(lVar37 + 0x48);
                  args.ray = (RTCRayN *)ray;
                  if (pRVar36 != (RTCRayN *)0x0) {
                    pRVar36 = (RTCRayN *)(*(code *)pRVar36)(&args);
                  }
                  if (local_b78 == (undefined1  [16])0x0) {
                    auVar85._8_4_ = 0xffffffff;
                    auVar85._0_8_ = 0xffffffffffffffff;
                    auVar85._12_4_ = 0xffffffff;
                    auVar85 = auVar85 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar37 + 0x3e) & 0x40) != 0)))
                       ) {
                      (*p_Var23)(&args);
                    }
                    auVar65._0_4_ = -(uint)(local_b78._0_4_ == 0);
                    auVar65._4_4_ = -(uint)(local_b78._4_4_ == 0);
                    auVar65._8_4_ = -(uint)(local_b78._8_4_ == 0);
                    auVar65._12_4_ = -(uint)(local_b78._12_4_ == 0);
                    auVar85 = auVar65 ^ _DAT_01febe20;
                    auVar54 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar65
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
                    pRVar36 = args.ray;
                  }
                  auVar86._0_4_ = auVar85._0_4_ << 0x1f;
                  auVar86._4_4_ = auVar85._4_4_ << 0x1f;
                  auVar86._8_4_ = auVar85._8_4_ << 0x1f;
                  auVar86._12_4_ = auVar85._12_4_ << 0x1f;
                  iVar43 = movmskps((int)pRVar36,auVar86);
                  bVar52 = iVar43 == 0;
                  if (bVar52) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar45;
                    uVar47 = uVar47 ^ 1L << (uVar46 & 0x3f);
                  }
                }
                if (!bVar52) goto LAB_00296150;
                uVar46 = local_b68;
                pNVar50 = local_b60;
              } while (uVar47 != 0);
            }
          }
          uVar39 = uVar39 + 1;
          bVar51 = uVar39 < uVar38;
        } while (uVar39 != uVar38);
      }
    }
    goto LAB_00296144;
  }
  goto LAB_0029617c;
LAB_00296150:
  uVar46 = local_b68;
  pNVar50 = local_b60;
  if (bVar51) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar48 = 1;
  }
LAB_00296144:
  if ((uVar48 & 3) != 0) {
LAB_0029617c:
    return pNVar49 != stack;
  }
  goto LAB_00294b1e;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }